

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O0

void sznet::net::sockets::sz_listenordie(sz_sock sockfd)

{
  LogStream *this;
  SourceFile file;
  undefined1 local_ff0 [12];
  Logger local_fe0;
  int local_10;
  sz_sock local_c;
  int ret;
  sz_sock sockfd_local;
  
  local_c = sockfd;
  local_10 = listen(sockfd,0x1000);
  if (local_10 < 0) {
    Logger::SourceFile::SourceFile<101>
              ((SourceFile *)local_ff0,
               (char (*) [101])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/SocketsOps.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_ff0._0_8_;
    file.m_size = local_ff0._8_4_;
    Logger::Logger(&local_fe0,file,0x10a,true);
    this = Logger::stream(&local_fe0);
    LogStream::operator<<(this,"sockets::sz_listenordie");
    Logger::~Logger(&local_fe0);
  }
  return;
}

Assistant:

void sz_listenordie(sz_sock sockfd)
{
	int ret = ::listen(sockfd, SOMAXCONN);
	if (ret < 0)
	{
		LOG_SYSFATAL << "sockets::sz_listenordie";
	}
}